

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall
Assimp::LWOImporter::CountVertsAndFacesLWO2
          (LWOImporter *this,uint *verts,uint *faces,uint16_t **cursor,uint16_t *end,uint max)

{
  ushort *puVar1;
  uint16_t *puVar2;
  ushort uVar3;
  ushort uVar5;
  bool bVar6;
  uint uVar4;
  
  while ((puVar1 = *cursor, puVar1 < end && (bVar6 = max != 0, max = max - 1, bVar6))) {
    *cursor = puVar1 + 1;
    uVar3 = *puVar1;
    uVar5 = (uVar3 & 0xff03) << 8 | uVar3 >> 8;
    *verts = *verts + (uint)uVar5;
    *faces = *faces + 1;
    if ((uVar3 & 0xff03) != 0) {
      puVar2 = *cursor;
      uVar4 = 1;
      if (1 < uVar5) {
        uVar4 = (uint)uVar5;
      }
      do {
        puVar2 = puVar2 + (ulong)((char)*puVar2 == -1) + 1;
        *cursor = puVar2;
        uVar3 = (short)uVar4 - 1;
        uVar4 = (uint)uVar3;
      } while (uVar3 != 0);
    }
  }
  return;
}

Assistant:

void LWOImporter::CountVertsAndFacesLWO2(unsigned int& verts, unsigned int& faces,
    uint16_t*& cursor, const uint16_t* const end, unsigned int max)
{
    while (cursor < end && max--)
    {
        uint16_t numIndices;
        ::memcpy(&numIndices, cursor++, 2);
        AI_LSWAP2(numIndices);
        numIndices &= 0x03FF;

        verts += numIndices;
        ++faces;

        for(uint16_t i = 0; i < numIndices; i++)
        {
            ReadVSizedIntLWO2((uint8_t*&)cursor);
        }
    }
}